

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCRef *
NULLCTypeInfo::MemberByName(NULLCRef *__return_storage_ptr__,NULLCRef obj,NULLCArray member)

{
  int iVar1;
  ExternTypeInfo *pEVar2;
  size_t sVar3;
  uint local_44;
  char *pcStack_40;
  uint i;
  char *memberName;
  char *str;
  ExternTypeInfo *exType;
  NULLCArray member_local;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x5a,"NULLCRef NULLCTypeInfo::MemberByName(NULLCRef, NULLCArray)");
  }
  pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),obj.typeID);
  if (pEVar2->subCat == CAT_CLASS) {
    pcStack_40 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar2->offsetToName)
    ;
    sVar3 = strlen(pcStack_40);
    pcStack_40 = pcStack_40 + sVar3 + 1;
    for (local_44 = 0; local_44 < (pEVar2->field_8).arrSize; local_44 = local_44 + 1) {
      iVar1 = strcmp(pcStack_40,member.ptr);
      if (iVar1 == 0) {
        MemberByIndex(__return_storage_ptr__,obj,local_44);
        return __return_storage_ptr__;
      }
      sVar3 = strlen(pcStack_40);
      pcStack_40 = pcStack_40 + sVar3 + 1;
    }
    memset(__return_storage_ptr__,0,0xc);
  }
  else {
    memset(__return_storage_ptr__,0,0xc);
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef MemberByName(NULLCRef obj, NULLCArray member)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[obj.typeID];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
			return NULLCRef();
		const char *str = &linker->exSymbols[exType.offsetToName];
		const char *memberName = str + strlen(str) + 1;
		for(unsigned i = 0; i < exType.memberCount; i++)
		{
			if(strcmp(memberName, member.ptr) == 0)
				return MemberByIndex(obj, i);
			memberName += strlen(memberName) + 1;
		}
		return NULLCRef();
	}